

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu-graphics.cpp
# Opt level: O0

undefined8 Game::Graphics::Menu::MainMenuOptionsPrompt_abi_cxx11_(void)

{
  char *pcVar1;
  const_iterator ppcVar2;
  ostream *poVar3;
  undefined8 in_RDI;
  char *txt;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<const_char_*> *__range2;
  ostringstream local_1c8 [8];
  ostringstream str_os;
  char *sp;
  char *pcStack_40;
  char *local_38;
  char *pcStack_30;
  undefined1 local_20 [8];
  initializer_list<const_char_*> menu_list_txt;
  
  local_38 = "3. View Highscores and Statistics";
  pcStack_30 = "4. Exit";
  sp = "1. Play a New Game";
  pcStack_40 = "2. Continue Previous Game";
  local_20 = (undefined1  [8])&sp;
  menu_list_txt._M_array = (iterator)0x4;
  std::__cxx11::ostringstream::ostringstream(local_1c8);
  std::operator<<((ostream *)local_1c8,"\n");
  __end2 = std::initializer_list<const_char_*>::begin((initializer_list<const_char_*> *)local_20);
  ppcVar2 = std::initializer_list<const_char_*>::end((initializer_list<const_char_*> *)local_20);
  for (; __end2 != ppcVar2; __end2 = __end2 + 1) {
    pcVar1 = *__end2;
    poVar3 = std::operator<<((ostream *)local_1c8,"        ");
    poVar3 = std::operator<<(poVar3,pcVar1);
    std::operator<<(poVar3,"\n");
  }
  std::operator<<((ostream *)local_1c8,"\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1c8);
  return in_RDI;
}

Assistant:

std::string MainMenuOptionsPrompt() {
  const auto menu_list_txt = {"1. Play a New Game", "2. Continue Previous Game",
                              "3. View Highscores and Statistics", "4. Exit"};
  constexpr auto sp = "        ";

  std::ostringstream str_os;

  str_os << "\n";
  for (const auto txt : menu_list_txt) {
    str_os << sp << txt << "\n";
  }
  str_os << "\n";

  return str_os.str();
}